

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElasticityKirchhoffOrthotropic::ChElasticityKirchhoffOrthotropic
          (ChElasticityKirchhoffOrthotropic *this,double m_E_x,double m_E_y,double m_nu_xy,
          double m_G_xy)

{
  (this->super_ChElasticityKirchhoff).section = (ChMaterialShellKirchhoff *)0x0;
  (this->super_ChElasticityKirchhoff)._vptr_ChElasticityKirchhoff =
       (_func_int **)&PTR__ChElasticityKirchhoff_00b2bbd8;
  this->E_x = m_E_x;
  this->E_y = m_E_y;
  this->nu_xy = m_nu_xy;
  this->G_xy = m_G_xy;
  return;
}

Assistant:

ChElasticityKirchhoffOrthotropic::ChElasticityKirchhoffOrthotropic(    double m_E_x,
                                                                       double m_E_y,
                                                                       double m_nu_xy,
                                                                       double m_G_xy) {
    E_x = m_E_x;
    E_y = m_E_y;
    nu_xy = m_nu_xy;
    G_xy = m_G_xy;
}